

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O0

NodeAVL * avlInsert0(NodeAVL *nd,NodeAVL *newNd)

{
  NodeAVL *pNVar1;
  NodeAVL *in_RSI;
  long in_RDI;
  NodeAVL *local_8;
  
  local_8 = in_RSI;
  if (in_RDI != 0) {
    if (*(double *)(in_RDI + 8) <= in_RSI->key) {
      pNVar1 = avlInsert0(in_RSI,(NodeAVL *)0x10e4d0);
      *(NodeAVL **)(in_RDI + 0x28) = pNVar1;
      *(long *)(*(long *)(in_RDI + 0x28) + 0x30) = in_RDI;
    }
    else {
      pNVar1 = avlInsert0(in_RSI,(NodeAVL *)0x10e49e);
      *(NodeAVL **)(in_RDI + 0x20) = pNVar1;
      *(long *)(*(long *)(in_RDI + 0x20) + 0x30) = in_RDI;
    }
    local_8 = avlBalance(in_RSI);
  }
  return local_8;
}

Assistant:

static
NodeAVL* avlInsert0( NodeAVL* nd, NodeAVL *newNd ){
    if( !nd ) return newNd;
    if( newNd->key < nd->key ){
        nd->left = avlInsert0( nd->left, newNd );
        nd->left->parent = nd;
    } else {
        nd->right = avlInsert0( nd->right, newNd );
        nd->right->parent = nd;
    }
    return avlBalance(nd);
}